

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::SeparatorEx(ImGuiSeparatorFlags flags)

{
  float fVar1;
  float fVar2;
  ImDrawList *pIVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  ImU32 IVar6;
  ImGuiWindow *pIVar7;
  ImVec2 local_b8;
  ImVec2 local_a8;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImVec2 local_90;
  undefined1 local_88 [8];
  ImRect bb_1;
  ImGuiColumns *columns;
  float x2;
  float x1;
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  ImVec2 local_48;
  undefined1 local_40 [8];
  ImRect bb;
  float y2;
  float y1;
  float thickness_layout;
  float thickness_draw;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImGuiSeparatorFlags flags_local;
  
  pIVar7 = GetCurrentWindow();
  pIVar4 = GImGui;
  if ((pIVar7->SkipItems & 1U) == 0) {
    bVar5 = ImIsPowerOfTwo(flags & 3);
    if (!bVar5) {
      __assert_fail("ImIsPowerOfTwo(flags & (ImGuiSeparatorFlags_Horizontal | ImGuiSeparatorFlags_Vertical))"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui_widgets.cpp"
                    ,0x4cb,"void ImGui::SeparatorEx(ImGuiSeparatorFlags)");
    }
    if ((flags & 2U) == 0) {
      if ((flags & 1U) != 0) {
        columns._4_4_ = (pIVar7->Pos).x;
        fVar1 = (pIVar7->Pos).x;
        fVar2 = (pIVar7->Size).x;
        bVar5 = ImVector<ImGuiGroupData>::empty(&(pIVar7->DC).GroupStack);
        if (!bVar5) {
          columns._4_4_ = (pIVar7->DC).Indent.x + columns._4_4_;
        }
        if ((flags & 4U) == 0) {
          local_b8.x = 0.0;
          local_b8.y = 0.0;
        }
        else {
          local_b8 = (ImVec2)(pIVar7->DC).CurrentColumns;
        }
        bb_1.Max = local_b8;
        if (local_b8 != (ImVec2)0x0) {
          PushColumnsBackground();
        }
        ImVec2::ImVec2(&local_90,columns._4_4_,(pIVar7->DC).CursorPos.y);
        ImVec2::ImVec2(&local_98,fVar1 + fVar2,(pIVar7->DC).CursorPos.y + 1.0);
        ImRect::ImRect((ImRect *)local_88,&local_90,&local_98);
        ImVec2::ImVec2(&local_a0,0.0,0.0);
        ItemSize(&local_a0,0.0);
        bVar5 = ItemAdd((ImRect *)local_88,0,(ImRect *)0x0);
        if (bVar5) {
          pIVar3 = pIVar7->DrawList;
          ImVec2::ImVec2(&local_a8,bb_1.Min.x,(float)local_88._4_4_);
          IVar6 = GetColorU32(0x1b,1.0);
          ImDrawList::AddLine(pIVar3,(ImVec2 *)local_88,&local_a8,IVar6,1.0);
          if ((pIVar4->LogEnabled & 1U) != 0) {
            LogRenderedText((ImVec2 *)local_88,"--------------------------------",(char *)0x0);
          }
          if (bb_1.Max != (ImVec2)0x0) {
            PopColumnsBackground();
            *(float *)((long)bb_1.Max + 0x1c) = (pIVar7->DC).CursorPos.y;
          }
        }
        else if (bb_1.Max != (ImVec2)0x0) {
          PopColumnsBackground();
        }
      }
    }
    else {
      bb.Max.y = (pIVar7->DC).CursorPos.y;
      bb.Max.x = (pIVar7->DC).CursorPos.y + (pIVar7->DC).CurrLineSize.y;
      ImVec2::ImVec2(&local_48,(pIVar7->DC).CursorPos.x,bb.Max.y);
      ImVec2::ImVec2(&local_50,(pIVar7->DC).CursorPos.x + 1.0,bb.Max.x);
      ImRect::ImRect((ImRect *)local_40,&local_48,&local_50);
      ImVec2::ImVec2(&local_58,0.0,0.0);
      ItemSize(&local_58,0.0);
      bVar5 = ItemAdd((ImRect *)local_40,0,(ImRect *)0x0);
      if (bVar5) {
        pIVar3 = pIVar7->DrawList;
        ImVec2::ImVec2(&local_60,(float)local_40._0_4_,(float)local_40._4_4_);
        ImVec2::ImVec2((ImVec2 *)&x2,(float)local_40._0_4_,bb.Min.y);
        IVar6 = GetColorU32(0x1b,1.0);
        ImDrawList::AddLine(pIVar3,&local_60,(ImVec2 *)&x2,IVar6,1.0);
        if ((pIVar4->LogEnabled & 1U) != 0) {
          LogText(" |");
        }
      }
    }
  }
  return;
}

Assistant:

void ImGui::SeparatorEx(ImGuiSeparatorFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    ImGuiContext& g = *GImGui;
    IM_ASSERT(ImIsPowerOfTwo(flags & (ImGuiSeparatorFlags_Horizontal | ImGuiSeparatorFlags_Vertical)));   // Check that only 1 option is selected

    float thickness_draw = 1.0f;
    float thickness_layout = 0.0f;
    if (flags & ImGuiSeparatorFlags_Vertical)
    {
        // Vertical separator, for menu bars (use current line height). Not exposed because it is misleading and it doesn't have an effect on regular layout.
        float y1 = window->DC.CursorPos.y;
        float y2 = window->DC.CursorPos.y + window->DC.CurrLineSize.y;
        const ImRect bb(ImVec2(window->DC.CursorPos.x, y1), ImVec2(window->DC.CursorPos.x + thickness_draw, y2));
        ItemSize(ImVec2(thickness_layout, 0.0f));
        if (!ItemAdd(bb, 0))
            return;

        // Draw
        window->DrawList->AddLine(ImVec2(bb.Min.x, bb.Min.y), ImVec2(bb.Min.x, bb.Max.y), GetColorU32(ImGuiCol_Separator));
        if (g.LogEnabled)
            LogText(" |");
    }
    else if (flags & ImGuiSeparatorFlags_Horizontal)
    {
        // Horizontal Separator
        float x1 = window->Pos.x;
        float x2 = window->Pos.x + window->Size.x;
        if (!window->DC.GroupStack.empty())
            x1 += window->DC.Indent.x;

        ImGuiColumns* columns = (flags & ImGuiSeparatorFlags_SpanAllColumns) ? window->DC.CurrentColumns : NULL;
        if (columns)
            PushColumnsBackground();

        // We don't provide our width to the layout so that it doesn't get feed back into AutoFit
        const ImRect bb(ImVec2(x1, window->DC.CursorPos.y), ImVec2(x2, window->DC.CursorPos.y + thickness_draw));
        ItemSize(ImVec2(0.0f, thickness_layout));
        if (!ItemAdd(bb, 0))
        {
            if (columns)
                PopColumnsBackground();
            return;
        }

        // Draw
        window->DrawList->AddLine(bb.Min, ImVec2(bb.Max.x, bb.Min.y), GetColorU32(ImGuiCol_Separator));
        if (g.LogEnabled)
            LogRenderedText(&bb.Min, "--------------------------------");

        if (columns)
        {
            PopColumnsBackground();
            columns->LineMinY = window->DC.CursorPos.y;
        }
    }
}